

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O3

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test::TestBody
          (SDLEventsSourceTests_returnMouseLeftButtonUpEvent_Test *this)

{
  TypedExpectation<int_(SDL_Event_&)> *this_00;
  undefined1 extraout_DL;
  pointer *__ptr;
  _Any_data *this_01;
  _Any_data *p_Var1;
  _func_int *message;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  undefined1 local_40 [8];
  MatcherBase<SDL_Event_&> local_38;
  MatcherBase<SDL_Event_&> local_20;
  
  this_01 = &local_68;
  p_Var1 = &local_68;
  local_20.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_20.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_003242b8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)local_40,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_20
            );
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                      ((MockSpec<int_(SDL_Event_&)> *)local_40,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                       ,0x4c,"*sdlMock","pollEvent(_)");
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:76:57)>
             ::_M_manager;
  local_50 = std::
             _Function_handler<int_(SDL_Event_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp:76:57)>
             ::_M_invoke;
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (this_00,(Action<int_(SDL_Event_&)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
    this_01 = p_Var1;
  }
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase
            ((MatcherBase<SDL_Event_&> *)(local_40 + 8));
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_20);
  local_68._M_unused._M_object =
       SDLEventsSource::getEvent
                 ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,
                  (SDLEventsSource *)this_01);
  local_68._M_pod_data[8] = extraout_DL;
  std::
  get<2ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
            ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              *)&local_68);
  testing::AssertionSuccess();
  if (local_40[0] == '\0') {
    testing::Message::Message((Message *)&local_68);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x298cf7;
    }
    else {
      message = *local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x54,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((Event *)local_68._M_unused._0_8_ != (Event *)0x0) {
      (**(code **)(*local_68._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_40 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_38.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonUpEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONUP;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    EXPECT_EQ(std::get<MouseLeftButtonUp>(eventsSource.getEvent()), MouseLeftButtonUp {});
}